

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
          (TPZNodeRep<3,_pztopology::TPZLine> *this,void **vtt,
          TPZNodeRep<3,_pztopology::TPZLine> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  bool bVar1;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_RCX;
  void **in_RSI;
  TPZLine *in_RDI;
  int64_t i;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff98;
  _Self local_48 [3];
  _Self local_30;
  key_type_conflict1 *__k;
  
  pztopology::TPZLine::TPZLine(in_RDI,in_RSI);
  (in_RDI->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*in_RSI;
  for (__k = (key_type_conflict1 *)0x0; (long)__k < 3; __k = (key_type_conflict1 *)((long)__k + 1))
  {
    local_30._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::find
                   (in_stack_ffffffffffffff98,(key_type_conflict1 *)0x17f83a3);
    local_48[0]._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   (in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_30,local_48);
    if (bVar1) {
      pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
    }
    in_stack_ffffffffffffff98 =
         (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](in_RCX,__k);
    in_RDI[(long)__k + 1].super_TPZSavable._vptr_TPZSavable =
         *(_func_int ***)&(in_stack_ffffffffffffff98->_M_t)._M_impl;
  }
  return;
}

Assistant:

TPZNodeRep<N,Topology>::TPZNodeRep(const TPZNodeRep<N,Topology> &cp, std::map<int64_t,int64_t> & gl2lcNdMap)
    : TPZRegisterClassId(&TPZNodeRep::ClassId)
	{
		int64_t i;
		for(i = 0; i < N; i++)
		{
			if (gl2lcNdMap.find(cp.fNodeIndexes[i]) == gl2lcNdMap.end())
            {
#ifdef PZ_LOG
                TPZLogger loggernoderep("pz.geom.noderep");
                if (loggernoderep.isErrorEnabled()) {
                  std::stringstream sout;
                  sout << "ERROR in - " << __PRETTY_FUNCTION__
                       << " trying to clone a node " << i << " index "
                       << cp.fNodeIndexes[i] << " which is not mapped";
                  LOGPZ_ERROR(loggernoderep, sout.str().c_str());
                }                                
#endif
				DebugStop();
			}
			fNodeIndexes[i] = gl2lcNdMap [ cp.fNodeIndexes[i] ];
		}
	}